

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_objects.hh
# Opt level: O0

void __thiscall
tchecker::
intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,unsigned_long,1ul>const>::
intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,unsigned_long,1ul>>
          (intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,unsigned_long,1ul>const>
           *this,intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>
                 *y)

{
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>
  *y_local;
  intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>
  *this_local;
  
  *(undefined8 *)this = 0;
  intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>
  ::reset((intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>
           *)this,y->_t);
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>::
  reset(y,(make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL> *)0x0);
  return;
}

Assistant:

explicit intrusive_shared_ptr_t(tchecker::intrusive_shared_ptr_t<Y> && y) : _t(nullptr)
  {
    reset(y._t); // DO NOT dynamic_cast<T *>(y._t) AS IT BREAKS REFERENCE COUNTER
    y.reset(nullptr);
  }